

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

VP8LRefsCursor * VP8LRefsCursorInit(VP8LRefsCursor *__return_storage_ptr__,VP8LBackwardRefs *refs)

{
  VP8LBackwardRefs *refs_local;
  
  __return_storage_ptr__->cur_block_ = refs->refs_;
  if (refs->refs_ == (PixOrCopyBlock *)0x0) {
    __return_storage_ptr__->cur_pos = (PixOrCopy *)0x0;
    __return_storage_ptr__->last_pos_ = (PixOrCopy *)0x0;
  }
  else {
    __return_storage_ptr__->cur_pos = __return_storage_ptr__->cur_block_->start_;
    __return_storage_ptr__->last_pos_ =
         __return_storage_ptr__->cur_pos + __return_storage_ptr__->cur_block_->size_;
  }
  return __return_storage_ptr__;
}

Assistant:

VP8LRefsCursor VP8LRefsCursorInit(const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c;
  c.cur_block_ = refs->refs_;
  if (refs->refs_ != NULL) {
    c.cur_pos = c.cur_block_->start_;
    c.last_pos_ = c.cur_pos + c.cur_block_->size_;
  } else {
    c.cur_pos = NULL;
    c.last_pos_ = NULL;
  }
  return c;
}